

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::removeNode(MemoryLeakDetectorTable *this,char *memory)

{
  unsigned_long uVar1;
  MemoryLeakDetectorNode *pMVar2;
  char *in_RSI;
  MemoryLeakDetectorTable *in_RDI;
  
  uVar1 = hash(in_RDI,in_RSI);
  pMVar2 = MemoryLeakDetectorList::removeNode(in_RDI->table_ + uVar1,in_RSI);
  return pMVar2;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::removeNode(char* memory)
{
    return table_[hash(memory)].removeNode(memory);
}